

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O0

JavascriptArrayBuffer * __thiscall
Js::AsmJsScriptFunction::GetAsmJsArrayBuffer(AsmJsScriptFunction *this)

{
  Type *ptr;
  void **ppvVar1;
  AsmJsScriptFunction *this_local;
  
  ptr = GetModuleEnvironment(this);
  ppvVar1 = Memory::PointerValue<void>(ptr);
  return (JavascriptArrayBuffer *)*ppvVar1;
}

Assistant:

JavascriptArrayBuffer* AsmJsScriptFunction::GetAsmJsArrayBuffer() const
    {
#ifdef ASMJS_PLAT
        return (JavascriptArrayBuffer*)PointerValue(
            *(this->GetModuleEnvironment() + AsmJsModuleMemory::MemoryTableBeginOffset));
#else
        Assert(UNREACHED);
        return nullptr;
#endif
    }